

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

void chunk_init(chunk *chunk,file *file)

{
  file *file_local;
  chunk *chunk_local;
  
  if (file->chunk == (chunk *)0x0) {
    clear(chunk,0x58);
    chunk->file = file;
    chunk->global = file->global;
    (chunk->chunk_data_pos).__pos = (file->data_pos).__pos;
    (chunk->chunk_data_pos).__state = (file->data_pos).__state;
    chunk->chunk_length = file->length;
    chunk->chunk_type = file->type;
    chunk->uncompressed_digits = 0;
    chunk->compressed_digits = 0;
    file->chunk = chunk;
    return;
  }
  __assert_fail("file->chunk == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                ,0x62c,"void chunk_init(struct chunk *const, struct file *const)");
}

Assistant:

static void
chunk_init(struct chunk * const chunk, struct file * const file)
   /* When a chunk is initialized the file length/type/pos are copied into the
    * corresponding chunk fields and the new chunk is registered in the file
    * structure.  There can only be one chunk at a time.
    *
    * NOTE: this routine must onely be called from the file alloc routine!
    */
{
   assert(file->chunk == NULL);

   CLEAR(*chunk);

   chunk->file = file;
   chunk->global = file->global;

   chunk->chunk_data_pos = file->data_pos;
   chunk->chunk_length = file->length;
   chunk->chunk_type = file->type;

   /* Compressed/uncompressed size information (from the zlib control structure
    * that is used to check the compressed data in a chunk.)
    */
   chunk->uncompressed_digits = 0;
   chunk->compressed_digits = 0;

   file->chunk = chunk;
}